

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmllint.c
# Opt level: O3

void * myReallocFunc(void *mem,size_t size)

{
  int iVar1;
  long lVar2;
  void *pvVar3;
  
  lVar2 = xmlMemSize();
  iVar1 = xmlMemUsed();
  if ((long)iVar1 + size == lVar2) {
    pvVar3 = (void *)xmlMemRealloc(mem,size);
    return pvVar3;
  }
  xmllintMaxmemReached = 1;
  return (void *)0x0;
}

Assistant:

static void *
myReallocFunc(void *mem, size_t size) {
    void *ret;
    size_t oldsize = xmlMemSize(mem);

    if (xmlMemUsed() + size - oldsize > (size_t) xmllintMaxmem) {
#if XMLLINT_ABORT_ON_FAILURE
        abort();
#endif
        xmllintMaxmemReached = 1;
        xmllintOom = 1;
        return(NULL);
    }

    ret = xmlMemRealloc(mem, size);
    if (ret == NULL)
        xmllintOom = 1;

    return(ret);
}